

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

bool slang::ast::StructurePattern::createVars
               (ASTContext *context,StructurePatternSyntax *syntax,Type *targetType,
               SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *results)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  string_view name;
  bool bVar1;
  StructurePatternMemberSyntax *pSVar2;
  SyntaxNode *pSVar3;
  SourceLocation SVar4;
  Symbol *syntax_00;
  SourceLocation in_RDI;
  string_view arg;
  SourceRange SVar5;
  FieldSymbol *field;
  Diagnostic *diag;
  Symbol *member;
  string_view memberName;
  NamedStructurePatternMemberSyntax *nspms;
  StructurePatternMemberSyntax *memberSyntax_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *__range3_1;
  PatternSyntax *patternSyntax;
  StructurePatternMemberSyntax *memberSyntax;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *__range3;
  specific_symbol_iterator<slang::ast::FieldSymbol> it;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  fields;
  Scope *structScope;
  bool result;
  SourceLocation in_stack_fffffffffffffe38;
  Type *in_stack_fffffffffffffe40;
  iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
  *in_stack_fffffffffffffe48;
  SourceLocation in_stack_fffffffffffffe50;
  ASTContext *in_stack_fffffffffffffe58;
  SourceLocation in_stack_fffffffffffffe60;
  SourceLocation in_stack_fffffffffffffe68;
  SourceLocation in_stack_fffffffffffffe70;
  DiagCode DVar6;
  FieldSymbol *in_stack_fffffffffffffe80;
  Type *in_stack_fffffffffffffe88;
  Diagnostic *in_stack_fffffffffffffe90;
  SourceLocation in_stack_fffffffffffffe98;
  SourceLocation in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *in_stack_fffffffffffffec0;
  Diagnostic *results_00;
  PatternSyntax *in_stack_fffffffffffffec8;
  ASTContext *in_stack_fffffffffffffed0;
  Diagnostic *local_128;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  local_60;
  Scope *local_50;
  bool local_41;
  SourceRange local_40;
  undefined4 local_2c;
  SourceLocation local_10;
  
  local_10 = in_RDI;
  bVar1 = Type::isStruct((Type *)in_stack_fffffffffffffe38);
  DVar6 = in_stack_fffffffffffffe70._4_4_;
  if (bVar1) {
    bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::empty
                      ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)0x72d7bb)
    ;
    DVar6 = in_stack_fffffffffffffe70._4_4_;
    if (!bVar1) {
      local_41 = true;
      Type::getCanonicalType(in_stack_fffffffffffffe40);
      local_50 = Symbol::as<slang::ast::Scope>((Symbol *)0x72d899);
      pSVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
               operator[]((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                          in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
      if ((pSVar2->super_SyntaxNode).kind == OrderedStructurePatternMember) {
        local_60 = Scope::membersOfType<slang::ast::FieldSymbol>((Scope *)in_stack_fffffffffffffe50)
        ;
        std::ranges::
        subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
        ::begin(&local_60);
        slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::begin
                  ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)0x72d915);
        slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::end
                  ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)0x72d932);
        while( true ) {
          bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>_>
                            ((self_type *)in_stack_fffffffffffffe40,
                             (iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*> *)
                             in_stack_fffffffffffffe38);
          DVar6 = in_stack_fffffffffffffe70._4_4_;
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          pSVar3 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                                 *)0x72d96f)->super_SyntaxNode;
          slang::syntax::SyntaxNode::as<slang::syntax::OrderedStructurePatternMemberSyntax>(pSVar3);
          SVar4 = (SourceLocation)
                  not_null<slang::syntax::PatternSyntax_*>::operator*
                            ((not_null<slang::syntax::PatternSyntax_*> *)0x72d990);
          std::ranges::
          subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
          ::end(&local_60);
          bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                            ((self_type *)in_stack_fffffffffffffe40,
                             (specific_symbol_iterator<slang::ast::FieldSymbol> *)
                             in_stack_fffffffffffffe38);
          if (bVar1) {
            SVar4 = in_stack_fffffffffffffe68;
            if ((local_41 & 1U) != 0) {
              in_stack_fffffffffffffe70 = local_10;
              slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe90);
              sourceRange_00.endLoc = in_stack_fffffffffffffe68;
              sourceRange_00.startLoc = in_stack_fffffffffffffe60;
              ASTContext::addDiag(in_stack_fffffffffffffe58,in_stack_fffffffffffffe70._4_4_,
                                  sourceRange_00);
              ast::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
              local_41 = false;
              SVar4 = in_stack_fffffffffffffe68;
            }
            Pattern::createPlaceholderVars
                      (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                      );
          }
          else {
            in_stack_fffffffffffffe60 = local_10;
            iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
            ::operator->((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                          *)0x72da8e);
            ValueSymbol::getType((ValueSymbol *)0x72da96);
            bVar1 = Pattern::createPatternVars
                              ((ASTContext *)in_stack_fffffffffffffe98,
                               (PatternSyntax *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                               (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)
                               in_stack_fffffffffffffe80);
            local_41 = (local_41 & 1U & bVar1) != 0;
            iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
            ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                      (in_stack_fffffffffffffe48,(int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
          }
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                      *)in_stack_fffffffffffffe40);
          in_stack_fffffffffffffe68 = SVar4;
        }
        std::ranges::
        subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
        ::end(&local_60);
        bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                          ((self_type *)in_stack_fffffffffffffe40,
                           (specific_symbol_iterator<slang::ast::FieldSymbol> *)
                           in_stack_fffffffffffffe38);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe90);
          sourceRange_01.endLoc = in_stack_fffffffffffffe68;
          sourceRange_01.startLoc = in_stack_fffffffffffffe60;
          ASTContext::addDiag((ASTContext *)local_10,DVar6,sourceRange_01);
          ast::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          local_41 = false;
        }
      }
      else {
        slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::begin
                  ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)0x72dbc3);
        slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::end
                  ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)0x72dbe0);
        while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>_>
                                 ((self_type *)in_stack_fffffffffffffe40,
                                  (iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>
                                   *)in_stack_fffffffffffffe38), ((bVar1 ^ 0xffU) & 1) != 0) {
          pSVar3 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                                 *)0x72dc1d)->super_SyntaxNode;
          slang::syntax::SyntaxNode::as<slang::syntax::NamedStructurePatternMemberSyntax>(pSVar3);
          arg = parsing::Token::valueText((Token *)in_stack_fffffffffffffe50);
          local_128 = (Diagnostic *)arg._M_str;
          name._M_str._0_4_ = in_stack_fffffffffffffea8;
          name._M_len = (size_t)in_stack_fffffffffffffea0;
          name._M_str._4_4_ = in_stack_fffffffffffffeac;
          results_00 = local_128;
          syntax_00 = Scope::find((Scope *)in_stack_fffffffffffffe98,name);
          if (syntax_00 == (Symbol *)0x0) {
            bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &stack0xfffffffffffffed0);
            if (!bVar1) {
              in_stack_fffffffffffffeac = 0x3a000a;
              in_stack_fffffffffffffe50 = local_10;
              SVar5 = parsing::Token::range((Token *)in_stack_fffffffffffffe60);
              in_stack_fffffffffffffe98 = SVar5.startLoc;
              in_stack_fffffffffffffea0 = SVar5.endLoc;
              SVar5.endLoc = in_stack_fffffffffffffe68;
              SVar5.startLoc = in_stack_fffffffffffffe60;
              ASTContext::addDiag(in_stack_fffffffffffffe58,in_stack_fffffffffffffe70._4_4_,SVar5);
              in_stack_fffffffffffffe88 = (Type *)arg._M_len;
              Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffe80,arg);
              ast::operator<<(local_128,in_stack_fffffffffffffe88);
              in_stack_fffffffffffffe90 = local_128;
            }
            not_null<slang::syntax::PatternSyntax_*>::operator*
                      ((not_null<slang::syntax::PatternSyntax_*> *)0x72dd6f);
            Pattern::createPlaceholderVars
                      ((ASTContext *)arg._M_len,(PatternSyntax *)syntax_00,
                       (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)results_00);
            local_41 = false;
          }
          else {
            in_stack_fffffffffffffe80 = Symbol::as<slang::ast::FieldSymbol>((Symbol *)0x72dd9b);
            in_stack_fffffffffffffe38 = local_10;
            in_stack_fffffffffffffe40 =
                 (Type *)not_null<slang::syntax::PatternSyntax_*>::operator*
                                   ((not_null<slang::syntax::PatternSyntax_*> *)0x72ddbd);
            ValueSymbol::getType((ValueSymbol *)0x72ddcc);
            bVar1 = Pattern::createPatternVars
                              ((ASTContext *)in_stack_fffffffffffffe98,
                               (PatternSyntax *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                               (SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *)
                               in_stack_fffffffffffffe80);
            local_41 = (local_41 & 1U & bVar1) != 0;
          }
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::iterator_base<const_slang::syntax::StructurePatternMemberSyntax_*>,_false>
                      *)in_stack_fffffffffffffe40);
        }
      }
      return (bool)(local_41 & 1);
    }
  }
  bVar1 = Type::isError((Type *)0x72d7d1);
  if ((!bVar1) &&
     (bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::empty
                        ((SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *)
                         0x72d7e6), !bVar1)) {
    local_2c = 0x870007;
    local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffe90);
    sourceRange.endLoc = in_stack_fffffffffffffe68;
    sourceRange.startLoc = in_stack_fffffffffffffe60;
    ASTContext::addDiag(in_stack_fffffffffffffe58,DVar6,sourceRange);
    ast::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  Pattern::createPlaceholderVars
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  return false;
}

Assistant:

bool StructurePattern::createVars(const ASTContext& context,
                                  const syntax::StructurePatternSyntax& syntax,
                                  const Type& targetType,
                                  SmallVector<const PatternVarSymbol*>& results) {
    if (!targetType.isStruct() || syntax.members.empty()) {
        if (!targetType.isError() && !syntax.members.empty())
            context.addDiag(diag::PatternStructType, syntax.sourceRange()) << targetType;

        createPlaceholderVars(context, syntax, results);
        return false;
    }

    bool result = true;
    auto& structScope = targetType.getCanonicalType().as<Scope>();

    if (syntax.members[0]->kind == SyntaxKind::OrderedStructurePatternMember) {
        auto fields = structScope.membersOfType<FieldSymbol>();
        auto it = fields.begin();
        for (auto memberSyntax : syntax.members) {
            auto& patternSyntax = *memberSyntax->as<OrderedStructurePatternMemberSyntax>().pattern;
            if (it == fields.end()) {
                if (result) {
                    context.addDiag(diag::PatternStructTooMany, memberSyntax->sourceRange())
                        << targetType;
                    result = false;
                }

                createPlaceholderVars(context, patternSyntax, results);
                continue;
            }

            result &= createPatternVars(context, patternSyntax, it->getType(), results);
            it++;
        }

        if (it != fields.end()) {
            context.addDiag(diag::PatternStructTooFew, syntax.sourceRange()) << targetType;
            result = false;
        }
    }
    else {
        for (auto memberSyntax : syntax.members) {
            auto& nspms = memberSyntax->as<NamedStructurePatternMemberSyntax>();
            auto memberName = nspms.name.valueText();
            auto member = structScope.find(memberName);
            if (!member) {
                if (!memberName.empty()) {
                    auto& diag = context.addDiag(diag::UnknownMember, nspms.name.range());
                    diag << memberName << targetType;
                }

                createPlaceholderVars(context, *nspms.pattern, results);
                result = false;
                continue;
            }

            auto& field = member->as<FieldSymbol>();
            result &= createPatternVars(context, *nspms.pattern, field.getType(), results);
        }
    }

    return result;
}